

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  float x1;
  float y1;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  ImVec2 *pIVar6;
  ImVec2 IVar7;
  long lVar8;
  ImVec2 *__dest;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  lVar8 = (long)(this->_Path).Size;
  if (lVar8 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                  ,0x70c,"T &ImVector<ImVec2>::back() [T = ImVec2]");
  }
  pIVar6 = (this->_Path).Data;
  x1 = pIVar6[lVar8 + -1].x;
  y1 = pIVar6[lVar8 + -1].y;
  if (num_segments != 0) {
    if (0 < num_segments) {
      iVar10 = 1;
      do {
        fVar13 = (float)iVar10 * (1.0 / (float)num_segments);
        fVar14 = 1.0 - fVar13;
        fVar15 = (fVar14 + fVar14) * fVar13;
        fVar1 = p2->x;
        fVar2 = p3->x;
        fVar3 = p2->y;
        fVar4 = p3->y;
        iVar11 = (this->_Path).Size;
        iVar5 = (this->_Path).Capacity;
        if (iVar11 == iVar5) {
          if (iVar5 == 0) {
            iVar9 = 8;
          }
          else {
            iVar9 = iVar5 / 2 + iVar5;
          }
          iVar11 = iVar11 + 1;
          if (iVar11 < iVar9) {
            iVar11 = iVar9;
          }
          if (iVar5 < iVar11) {
            __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar11 << 3);
            pIVar6 = (this->_Path).Data;
            if (pIVar6 != (ImVec2 *)0x0) {
              memcpy(__dest,pIVar6,(long)(this->_Path).Size << 3);
              ImGui::MemFree((this->_Path).Data);
            }
            (this->_Path).Data = __dest;
            (this->_Path).Capacity = iVar11;
          }
        }
        IVar7.y = fVar13 * fVar13 * fVar4 + fVar14 * fVar14 * y1 + fVar15 * fVar3;
        IVar7.x = fVar2 * fVar13 * fVar13 + fVar14 * fVar14 * x1 + fVar1 * fVar15;
        (this->_Path).Data[(this->_Path).Size] = IVar7;
        (this->_Path).Size = (this->_Path).Size + 1;
        bVar12 = iVar10 != num_segments;
        iVar10 = iVar10 + 1;
      } while (bVar12);
    }
    return;
  }
  PathBezierQuadraticCurveToCasteljau
            (&this->_Path,x1,y1,p2->x,p2->y,p3->x,p3->y,this->_Data->CurveTessellationTol,0);
  return;
}

Assistant:

void ImDrawList::PathBezierQuadraticCurveTo(const ImVec2& p2, const ImVec2& p3, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierQuadraticCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, _Data->CurveTessellationTol, 0);// Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierQuadraticCalc(p1, p2, p3, t_step * i_step));
    }
}